

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt,int qualified)

{
  uint val;
  int iVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlChar *pxVar5;
  long lVar6;
  uint len;
  int l;
  xmlChar buf [105];
  int local_b0;
  int local_ac;
  xmlChar local_a8 [120];
  
  val = xmlXPathCurrentChar(ctxt,&local_b0);
  if ((val - 0x20 < 0x3e) && ((0x2800000140008401U >> ((ulong)(val - 0x20) & 0x3f) & 1) != 0)) {
    return (xmlChar *)0x0;
  }
  if (val < 0x100) {
    if ((((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) && (val != 0x5f)) && (val < 0xf8)) &&
       ((0x1e < val - 0xd8 && (val != 0x3a || qualified == 0)))) {
      return (xmlChar *)0x0;
    }
  }
  else {
    iVar1 = xmlCharInRange(val,&xmlIsBaseCharGroup);
    if ((iVar1 == 0) && ((val - 0x302a < 0xfffffff7 && val - 0x9fa6 < 0xffffae5a) && val != 0x3007))
    {
      return (xmlChar *)0x0;
    }
  }
  len = 0;
  local_ac = qualified;
  do {
    if ((val < 0x3f) && ((0x4000800100000000U >> ((ulong)val & 0x3f) & 1) != 0)) goto LAB_001dcf57;
    if (val < 0x100) {
      if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) &&
         ((9 < val - 0x30 && 0x1e < val - 0xd8) && val < 0xf8)) {
LAB_001dce9c:
        if (((0x32 < val - 0x2d) || ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0))
           && (local_ac == 0 || val != 0x3a)) {
          if (val < 0x100) {
            uVar3 = (uint)(val == 0xb7);
          }
          else {
            iVar1 = xmlCharInRange(val,&xmlIsCombiningGroup);
            if (iVar1 != 0) goto LAB_001dceb5;
            uVar3 = xmlCharInRange(val,&xmlIsExtenderGroup);
          }
          if (uVar3 == 0) {
LAB_001dcf57:
            if (len == 0) {
              return (xmlChar *)0x0;
            }
            pxVar4 = xmlStrndup(local_a8,len);
            return pxVar4;
          }
        }
      }
    }
    else {
      iVar1 = xmlCharInRange(val,&xmlIsBaseCharGroup);
      if (((iVar1 == 0) && ((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007)) &&
         (iVar1 = xmlCharInRange(val,&xmlIsDigitGroup), iVar1 == 0)) goto LAB_001dce9c;
    }
LAB_001dceb5:
    lVar6 = (long)local_b0;
    if (lVar6 == 1) {
      local_a8[(int)len] = (xmlChar)val;
      len = len + 1;
    }
    else {
      iVar1 = xmlCopyChar(local_b0,local_a8 + (int)len,val);
      len = len + iVar1;
    }
    ctxt->cur = ctxt->cur + lVar6;
    val = xmlXPathCurrentChar(ctxt,&local_b0);
  } while ((int)len < 100);
  if (50000 < len) {
LAB_001dd170:
    iVar1 = 7;
    goto LAB_001dd18e;
  }
  iVar1 = len * 2;
  pxVar4 = (xmlChar *)(*xmlMallocAtomic)((size_t)iVar1);
  if (pxVar4 != (xmlChar *)0x0) {
    memcpy(pxVar4,local_a8,(ulong)len);
    do {
      if (val < 0x100) {
        if ((0x16 < val - 0xc0 && 0x19 < (val & 0xdf) - 0x41) &&
           ((9 < val - 0x30 && 0x1e < val - 0xd8) && val < 0xf8)) {
LAB_001dd058:
          if (((0x32 < val - 0x2d) || ((0x4000000000003U >> ((ulong)(val - 0x2d) & 0x3f) & 1) == 0))
             && (local_ac == 0 || val != 0x3a)) {
            if (val < 0x100) {
              uVar3 = (uint)(val == 0xb7);
            }
            else {
              iVar2 = xmlCharInRange(val,&xmlIsCombiningGroup);
              if (iVar2 != 0) goto LAB_001dd079;
              uVar3 = xmlCharInRange(val,&xmlIsExtenderGroup);
            }
            if (uVar3 == 0) {
              pxVar4[(int)len] = '\0';
              return pxVar4;
            }
          }
        }
      }
      else {
        iVar2 = xmlCharInRange(val,&xmlIsBaseCharGroup);
        if (((iVar2 == 0) && ((8 < val - 0x3021 && 0x51a5 < val - 0x4e00) && val != 0x3007)) &&
           (iVar2 = xmlCharInRange(val,&xmlIsDigitGroup), iVar2 == 0)) goto LAB_001dd058;
      }
LAB_001dd079:
      pxVar5 = pxVar4;
      if (iVar1 < (int)(len + 10)) {
        if (50000 < iVar1) {
          (*xmlFree)(pxVar4);
          goto LAB_001dd170;
        }
        iVar1 = iVar1 * 2;
        pxVar5 = (xmlChar *)(*xmlRealloc)(pxVar4,(size_t)iVar1);
        if (pxVar5 == (xmlChar *)0x0) goto LAB_001dd17a;
      }
      pxVar4 = pxVar5;
      if (local_b0 == 1) {
        lVar6 = (long)(int)len;
        len = len + 1;
        pxVar4[lVar6] = (xmlChar)val;
      }
      else {
        iVar2 = xmlCopyChar(local_b0,pxVar4 + (int)len,val);
        len = iVar2 + len;
      }
      ctxt->cur = ctxt->cur + local_b0;
      val = xmlXPathCurrentChar(ctxt,&local_b0);
    } while( true );
  }
LAB_001dd186:
  iVar1 = 0xf;
LAB_001dd18e:
  xmlXPathErr(ctxt,iVar1);
  return (xmlChar *)0x0;
LAB_001dd17a:
  (*xmlFree)(pxVar4);
  goto LAB_001dd186;
}

Assistant:

static xmlChar *
xmlXPathParseNameComplex(xmlXPathParserContextPtr ctxt, int qualified) {
    xmlChar buf[XML_MAX_NAMELEN + 5];
    int len = 0, l;
    int c;

    /*
     * Handler for more complex cases
     */
    c = CUR_CHAR(l);
    if ((c == ' ') || (c == '>') || (c == '/') || /* accelerators */
        (c == '[') || (c == ']') || (c == '@') || /* accelerators */
        (c == '*') || /* accelerators */
	(!IS_LETTER(c) && (c != '_') &&
         ((!qualified) || (c != ':')))) {
	return(NULL);
    }

    while ((c != ' ') && (c != '>') && (c != '/') && /* test bigname.xml */
	   ((IS_LETTER(c)) || (IS_DIGIT(c)) ||
            (c == '.') || (c == '-') ||
	    (c == '_') || ((qualified) && (c == ':')) ||
	    (IS_COMBINING(c)) ||
	    (IS_EXTENDER(c)))) {
	COPY_BUF(l,buf,len,c);
	NEXTL(l);
	c = CUR_CHAR(l);
	if (len >= XML_MAX_NAMELEN) {
	    /*
	     * Okay someone managed to make a huge name, so he's ready to pay
	     * for the processing speed.
	     */
	    xmlChar *buffer;
	    int max = len * 2;

            if (len > XML_MAX_NAME_LENGTH) {
                XP_ERRORNULL(XPATH_EXPR_ERROR);
            }
	    buffer = (xmlChar *) xmlMallocAtomic(max);
	    if (buffer == NULL) {
		XP_ERRORNULL(XPATH_MEMORY_ERROR);
	    }
	    memcpy(buffer, buf, len);
	    while ((IS_LETTER(c)) || (IS_DIGIT(c)) || /* test bigname.xml */
		   (c == '.') || (c == '-') ||
		   (c == '_') || ((qualified) && (c == ':')) ||
		   (IS_COMBINING(c)) ||
		   (IS_EXTENDER(c))) {
		if (len + 10 > max) {
                    xmlChar *tmp;
                    if (max > XML_MAX_NAME_LENGTH) {
                        xmlFree(buffer);
                        XP_ERRORNULL(XPATH_EXPR_ERROR);
                    }
		    max *= 2;
		    tmp = (xmlChar *) xmlRealloc(buffer, max);
		    if (tmp == NULL) {
                        xmlFree(buffer);
			XP_ERRORNULL(XPATH_MEMORY_ERROR);
		    }
                    buffer = tmp;
		}
		COPY_BUF(l,buffer,len,c);
		NEXTL(l);
		c = CUR_CHAR(l);
	    }
	    buffer[len] = 0;
	    return(buffer);
	}
    }
    if (len == 0)
	return(NULL);
    return(xmlStrndup(buf, len));
}